

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::~Iterator(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
            *this)

{
  reset(this);
  Lib::Stack<Lib::BacktrackData>::~Stack(&this->_bdStack);
  Lib::
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
  ::~Stack(&this->_nodeIterators);
  Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::
  ~OptionBase(&(this->_leafData).
               super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>
             );
  Lib::Stack<unsigned_int>::~Stack(&this->_svStack);
  return;
}

Assistant:

~Iterator()
      { reset(); }